

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.h
# Opt level: O0

Orphan<capnproto_test::capnp::test::TestInterface> * __thiscall
capnp::Orphan<capnp::DynamicValue>::releaseAs<capnproto_test::capnp::test::TestInterface>
          (Orphan<capnproto_test::capnp::test::TestInterface> *__return_storage_ptr__,
          Orphan<capnp::DynamicValue> *this)

{
  OrphanBuilder *builder;
  Builder local_70;
  BuilderFor<capnproto_test::capnp::test::TestInterface> local_30;
  Orphan<capnp::DynamicValue> *local_18;
  Orphan<capnp::DynamicValue> *this_local;
  
  local_18 = this;
  this_local = (Orphan<capnp::DynamicValue> *)__return_storage_ptr__;
  get(&local_70,this);
  DynamicValue::Builder::as<capnproto_test::capnp::test::TestInterface>(&local_30,&local_70);
  capnproto_test::capnp::test::TestInterface::Client::~Client(&local_30);
  DynamicValue::Builder::~Builder(&local_70);
  this->type = UNKNOWN;
  builder = kj::mv<capnp::_::OrphanBuilder>(&this->builder);
  capnp::Orphan<capnproto_test::capnp::test::TestInterface>::Orphan(__return_storage_ptr__,builder);
  return __return_storage_ptr__;
}

Assistant:

Orphan<T> Orphan<DynamicValue>::releaseAs() {
  get().as<T>();  // type check
  type = DynamicValue::UNKNOWN;
  return Orphan<T>(kj::mv(builder));
}